

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O2

int64_t __thiscall leveldb::VersionSet::MaxNextLevelOverlappingBytes(VersionSet *this)

{
  Version *this_00;
  pointer ppFVar1;
  FileMetaData *pFVar2;
  long lVar3;
  int64_t iVar4;
  size_t i;
  ulong uVar5;
  long lVar6;
  long lVar7;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> overlaps;
  
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  overlaps.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar7 = 0;
  lVar3 = 1;
  while (lVar6 = lVar3, lVar6 != 6) {
    uVar5 = 0;
    while( true ) {
      this_00 = this->current_;
      ppFVar1 = this_00->files_[lVar6].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar6 + 1;
      if ((ulong)((long)this_00->files_[lVar6].
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3) <= uVar5)
      break;
      pFVar2 = ppFVar1[uVar5];
      Version::GetOverlappingInputs
                (this_00,(int)(lVar6 + 1),&pFVar2->smallest,&pFVar2->largest,&overlaps);
      iVar4 = TotalFileSize(&overlaps);
      if (lVar7 < iVar4) {
        lVar7 = iVar4;
      }
      uVar5 = uVar5 + 1;
    }
  }
  std::_Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
  ~_Vector_base(&overlaps.
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
               );
  return lVar7;
}

Assistant:

int64_t VersionSet::MaxNextLevelOverlappingBytes() {
  int64_t result = 0;
  std::vector<FileMetaData*> overlaps;
  for (int level = 1; level < config::kNumLevels - 1; level++) {
    for (size_t i = 0; i < current_->files_[level].size(); i++) {
      const FileMetaData* f = current_->files_[level][i];
      current_->GetOverlappingInputs(level + 1, &f->smallest, &f->largest,
                                     &overlaps);
      const int64_t sum = TotalFileSize(overlaps);
      if (sum > result) {
        result = sum;
      }
    }
  }
  return result;
}